

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O2

bean_ptr<Person> * __thiscall
hiberlite::Database::copyBean<Person>
          (bean_ptr<Person> *__return_storage_ptr__,Database *this,Person *c)

{
  Person *this_00;
  
  this_00 = (Person *)operator_new(0x40);
  Person::Person(this_00,c);
  manageBean<Person>(__return_storage_ptr__,this,this_00);
  return __return_storage_ptr__;
}

Assistant:

bean_ptr<C> Database::copyBean(const C& c)
{
	return manageBean<C>( new C(c) );
}